

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cpp
# Opt level: O0

Matrix * __thiscall Matrix::print(Matrix *this)

{
  ulong local_20;
  size_t j;
  size_t i;
  Matrix *this_local;
  
  for (j = 0; j < this->rows; j = j + 1) {
    for (local_20 = 0; local_20 < this->cols; local_20 = local_20 + 1) {
      std::ostream::operator<<((ostream *)&std::cout,this->data[j * this->cols + local_20]);
    }
    std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  }
  return this;
}

Assistant:

Matrix* Matrix::print() {
	for (size_t i = 0; i < rows; i++) {
		for (size_t j = 0; j < cols; j++) {
			std::cout << data[i * cols + j];
		}
		std::cout << std::endl;
	}
	return this;
}